

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O2

DdGen * Cudd_FirstNode(DdManager *dd,DdNode *f,DdNode **node)

{
  DdNodePtr pDVar1;
  undefined8 in_RAX;
  DdGen *__ptr;
  DdNodePtr *ppDVar2;
  int size;
  
  size = (int)((ulong)in_RAX >> 0x20);
  if (f != (DdNode *)0x0 && dd != (DdManager *)0x0) {
    __ptr = (DdGen *)malloc(0x38);
    if (__ptr != (DdGen *)0x0) {
      __ptr->manager = dd;
      __ptr->type = 2;
      __ptr->status = 0;
      (__ptr->stack).sp = 0;
      __ptr->node = (DdNode *)0x0;
      ppDVar2 = cuddNodeArray((DdNode *)((ulong)f & 0xfffffffffffffffe),&size);
      (__ptr->stack).stack = ppDVar2;
      if (ppDVar2 != (DdNodePtr *)0x0) {
        (__ptr->gen).nodes.size = size;
        if (size < 1) {
          return __ptr;
        }
        __ptr->status = 1;
        pDVar1 = *ppDVar2;
        __ptr->node = pDVar1;
        *node = pDVar1;
        return __ptr;
      }
      free(__ptr);
    }
    dd->errorCode = CUDD_MEMORY_OUT;
  }
  return (DdGen *)0x0;
}

Assistant:

DdGen *
Cudd_FirstNode(
  DdManager * dd,
  DdNode * f,
  DdNode ** node)
{
    DdGen *gen;
    int size;

    /* Sanity Check. */
    if (dd == NULL || f == NULL) return(NULL);

    /* Allocate generator an initialize it. */
    gen = ABC_ALLOC(DdGen,1);
    if (gen == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }

    gen->manager = dd;
    gen->type = CUDD_GEN_NODES;
    gen->status = CUDD_GEN_EMPTY;
    gen->stack.sp = 0;
    gen->node = NULL;

    /* Collect all the nodes on the generator stack for later perusal. */
    gen->stack.stack = cuddNodeArray(Cudd_Regular(f), &size);
    if (gen->stack.stack == NULL) {
        ABC_FREE(gen);
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    gen->gen.nodes.size = size;

    /* Find the first node. */
    if (gen->stack.sp < gen->gen.nodes.size) {
        gen->status = CUDD_GEN_NONEMPTY;
        gen->node = gen->stack.stack[gen->stack.sp];
        *node = gen->node;
    }

    return(gen);

}